

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

gravity_object_t * gravity_class_lookup(gravity_class_t *c,gravity_value_t key)

{
  gravity_value_t *pgVar1;
  gravity_value_t *v;
  gravity_class_t *c_local;
  gravity_value_t key_local;
  
  v = (gravity_value_t *)c;
  while( true ) {
    if (v == (gravity_value_t *)0x0) {
      return (gravity_object_t *)0x0;
    }
    pgVar1 = gravity_hash_lookup((gravity_hash_t *)v[6].isa,key);
    if (pgVar1 != (gravity_value_t *)0x0) break;
    v = (gravity_value_t *)v[5].isa;
  }
  return (gravity_object_t *)(pgVar1->field_1).n;
}

Assistant:

inline gravity_object_t *gravity_class_lookup (gravity_class_t *c, gravity_value_t key) {
    while (c) {
        gravity_value_t *v = gravity_hash_lookup(c->htable, key);
        if (v) return (gravity_object_t *)v->p;
        c = c->superclass;
    }
    return NULL;
}